

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

BYTE * __thiscall FBehavior::FindChunk(FBehavior *this,DWORD id)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  
  for (pDVar2 = (DWORD *)this->Chunks;
      ((pDVar1 = (DWORD *)0x0, pDVar2 != (DWORD *)0x0 && (pDVar2 < this->Data + this->DataSize)) &&
      (pDVar1 = pDVar2, *pDVar2 != id)); pDVar2 = (DWORD *)((long)pDVar2 + (ulong)(pDVar2[1] + 8)))
  {
  }
  return (BYTE *)pDVar1;
}

Assistant:

BYTE *FBehavior::FindChunk (DWORD id) const
{
	BYTE *chunk = Chunks;

	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}